

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_easy_recv(CURL *curl,void *buffer,size_t buflen,size_t *n)

{
  SessionHandle *data;
  connectdata *c;
  ssize_t n1;
  CURLcode result;
  curl_socket_t sfd;
  size_t *n_local;
  size_t buflen_local;
  void *buffer_local;
  CURL *curl_local;
  
  _result = n;
  n_local = (size_t *)buflen;
  buflen_local = (size_t)buffer;
  buffer_local = curl;
  n1._0_4_ = easy_connection((SessionHandle *)curl,(curl_socket_t *)((long)&n1 + 4),
                             (connectdata **)&data);
  curl_local._4_4_ = (CURLcode)n1;
  if ((CURLcode)n1 == CURLE_OK) {
    *_result = 0;
    curl_local._4_4_ =
         Curl_read((connectdata *)data,n1._4_4_,(char *)buflen_local,(size_t)n_local,(ssize_t *)&c);
    if (curl_local._4_4_ == CURLE_OK) {
      *_result = (size_t)c;
      curl_local._4_4_ = CURLE_OK;
    }
  }
  return curl_local._4_4_;
}

Assistant:

CURLcode curl_easy_recv(CURL *curl, void *buffer, size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c;
  struct SessionHandle *data = (struct SessionHandle *)curl;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_read(c, sfd, buffer, buflen, &n1);

  if(result)
    return result;

  *n = (size_t)n1;

  return CURLE_OK;
}